

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O1

void Ssw_ManBuildCone_rec(Ssw_Man_t *p,Aig_Obj_t *pObj)

{
  ulong uVar1;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswLcorr.c"
                  ,0x8b,"void Ssw_ManBuildCone_rec(Ssw_Man_t *, Aig_Obj_t *)");
  }
  if (p->pNodeToFrames[(long)pObj->Id * (long)p->nFrames] == (Aig_Obj_t *)0x0) {
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswLcorr.c"
                    ,0x8e,"void Ssw_ManBuildCone_rec(Ssw_Man_t *, Aig_Obj_t *)");
    }
    Ssw_ManBuildCone_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Ssw_ManBuildCone_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    uVar1 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar1 == 0) {
      pAVar2 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = (Aig_Obj_t *)
               ((ulong)((uint)pObj->pFanin0 & 1) ^
               (ulong)p->pNodeToFrames[(long)*(int *)(uVar1 + 0x24) * (long)p->nFrames]);
    }
    uVar1 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    if (uVar1 == 0) {
      p1 = (Aig_Obj_t *)0x0;
    }
    else {
      p1 = (Aig_Obj_t *)
           ((ulong)((uint)pObj->pFanin1 & 1) ^
           (ulong)p->pNodeToFrames[(long)*(int *)(uVar1 + 0x24) * (long)p->nFrames]);
    }
    pAVar2 = Aig_And(p->pFrames,pAVar2,p1);
    p->pNodeToFrames[(long)pObj->Id * (long)p->nFrames] = pAVar2;
  }
  return;
}

Assistant:

void Ssw_ManBuildCone_rec( Ssw_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew;
    assert( !Aig_IsComplement(pObj) );
    if ( Ssw_ObjFrame( p, pObj, 0 ) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Ssw_ManBuildCone_rec( p, Aig_ObjFanin0(pObj) );
    Ssw_ManBuildCone_rec( p, Aig_ObjFanin1(pObj) );
    pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, 0), Ssw_ObjChild1Fra(p, pObj, 0) );
    Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
}